

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialDistribution.test.cpp
# Opt level: O3

string * chunkLF11_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             "-3.000000+7 0.000000+0          0         11          1          29222 5 18     \n          2          2                                            9222 5 18     \n 1.000000-5 1.000000+0 3.000000+7 1.000000+0                      9222 5 18     \n 0.000000+0 0.000000+0          0          0          1          39222 5 18     \n          3          2                                            9222 5 18     \n 1.000000-5 9.770000+5 1.500000+6 1.000000+6 3.000000+7 1.060000+69222 5 18     \n 0.000000+0 0.000000+0          0          0          1          59222 5 18     \n          5          2                                            9222 5 18     \n 1.000000-5 2.546000-6 1.500000+6 2.546000-6 1.000000+7 2.474000-69222 5 18     \n 1.220000+7 2.612000-6 3.000000+7 2.620000-6                      9222 5 18     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string chunkLF11() {
  return
    "-3.000000+7 0.000000+0          0         11          1          29222 5 18     \n"
    "          2          2                                            9222 5 18     \n"
    " 1.000000-5 1.000000+0 3.000000+7 1.000000+0                      9222 5 18     \n"
    " 0.000000+0 0.000000+0          0          0          1          39222 5 18     \n"
    "          3          2                                            9222 5 18     \n"
    " 1.000000-5 9.770000+5 1.500000+6 1.000000+6 3.000000+7 1.060000+69222 5 18     \n"
    " 0.000000+0 0.000000+0          0          0          1          59222 5 18     \n"
    "          5          2                                            9222 5 18     \n"
    " 1.000000-5 2.546000-6 1.500000+6 2.546000-6 1.000000+7 2.474000-69222 5 18     \n"
    " 1.220000+7 2.612000-6 3.000000+7 2.620000-6                      9222 5 18     \n";
}